

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall miniros::RPCManager::releaseXMLRPCClient(RPCManager *this,XmlRpcClient *c)

{
  const_iterator __position;
  
  std::mutex::lock(&this->clients_mutex_);
  __position._M_current =
       (this->clients_).
       super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->clients_).
        super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002404dd:
      pthread_mutex_unlock((pthread_mutex_t *)&this->clients_mutex_);
      return;
    }
    if ((__position._M_current)->client_ == c) {
      if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
        (__position._M_current)->in_use_ = false;
      }
      else {
        (*((__position._M_current)->client_->super_XmlRpcSource)._vptr_XmlRpcSource[2])();
        if ((__position._M_current)->client_ != (XmlRpcClient *)0x0) {
          (*((__position._M_current)->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
        }
        std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::
        erase(&this->clients_,__position);
      }
      goto LAB_002404dd;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void RPCManager::releaseXMLRPCClient(XmlRpcClient *c)
{
  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); i != clients_.end(); ++i)
  {
    if (c == i->client_)
    {
      if (shutting_down_)
      {
        // if we are shutting down we won't be re-using the client
        i->client_->close();
        delete i->client_;
        clients_.erase(i);
      }
      else
      {
        i->in_use_ = false;
      }
      break;
    }
  }
}